

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Tokenizer::Tokenizer
          (Tokenizer *this,ZeroCopyInputStream *input,ErrorCollector *error_collector)

{
  (this->current_).text._M_dataplus._M_p = (pointer)&(this->current_).text.field_2;
  (this->current_).text._M_string_length = 0;
  (this->current_).text.field_2._M_local_buf[0] = '\0';
  (this->previous_).text._M_dataplus._M_p = (pointer)&(this->previous_).text.field_2;
  (this->previous_).text._M_string_length = 0;
  (this->previous_).text.field_2._M_local_buf[0] = '\0';
  this->input_ = input;
  this->error_collector_ = error_collector;
  this->line_ = 0;
  this->column_ = 0;
  this->record_target_ = (string *)0x0;
  this->buffer_ = (char *)0x0;
  this->buffer_size_ = 0;
  this->buffer_pos_ = 0;
  this->read_error_ = false;
  this->record_start_ = -1;
  this->allow_f_after_float_ = false;
  this->comment_style_ = CPP_COMMENT_STYLE;
  (this->current_).line = 0;
  (this->current_).column = 0;
  (this->current_).end_column = 0;
  (this->current_).type = TYPE_START;
  Refresh(this);
  return;
}

Assistant:

Tokenizer::Tokenizer(ZeroCopyInputStream* input,
                     ErrorCollector* error_collector)
  : input_(input),
    error_collector_(error_collector),
    buffer_(NULL),
    buffer_size_(0),
    buffer_pos_(0),
    read_error_(false),
    line_(0),
    column_(0),
    record_target_(NULL),
    record_start_(-1),
    allow_f_after_float_(false),
    comment_style_(CPP_COMMENT_STYLE) {

  current_.line = 0;
  current_.column = 0;
  current_.end_column = 0;
  current_.type = TYPE_START;

  Refresh();
}